

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::registerScenePosItem(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  long lVar1;
  QGraphicsScenePrivate *in_RSI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  QGraphicsItem *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSet<QGraphicsItem_*>::insert
            ((QSet<QGraphicsItem_*> *)in_stack_ffffffffffffffe8,
             (QGraphicsItem **)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  setScenePosItemEnabled(in_RSI,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::registerScenePosItem(QGraphicsItem *item)
{
    scenePosItems.insert(item);
    setScenePosItemEnabled(item, true);
}